

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_resume_normal_shape(player *p)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  player_shape *ppVar3;
  
  ppVar3 = lookup_player_shape("normal");
  p->shape = ppVar3;
  msg("You resume your usual shape.");
  player_clear_timed(p,L'*',true,false);
  ppVar2 = p->upkeep;
  puVar1 = &ppVar2->update;
  *puVar1 = *puVar1 | 1;
  puVar1 = &ppVar2->redraw;
  *(byte *)puVar1 = (byte)*puVar1 | 3;
  handle_stuff(p);
  return;
}

Assistant:

void player_resume_normal_shape(struct player *p)
{
	p->shape = lookup_player_shape("normal");
	msg("You resume your usual shape.");

	/* Kill vampire attack */
	(void) player_clear_timed(p, TMD_ATT_VAMP, true, false);

	/* Update */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->redraw |= (PR_TITLE | PR_MISC);
	handle_stuff(p);
}